

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ImGuiID id;
  ulong uVar4;
  char *pcVar5;
  ImGuiTableColumn *pIVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImRect hit_rect;
  bool local_66;
  bool local_65;
  float local_64;
  ImRect local_60;
  ImGuiContext *local_50;
  undefined1 local_48 [16];
  
  local_50 = GImGui;
  if ((table->Flags & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x221f,"TableUpdateBorders","ImGui ASSERT FAILED: %s",
                "table->Flags & ImGuiTableFlags_Resizable");
  }
  if (table->IsUsingHeaders == false) {
    bVar2 = 1;
  }
  else {
    bVar2 = (*(byte *)((long)&table->Flags + 1) & 8) >> 3;
  }
  local_64 = (table->OuterRect).Min.y;
  if (bVar2 == 0) {
    fVar8 = table->LastFirstRowHeight + local_64;
  }
  else {
    fVar8 = (table->OuterRect).Max.y;
    fVar9 = table->LastOuterHeight + local_64;
    uVar7 = -(uint)(fVar9 <= fVar8);
    fVar8 = (float)(uVar7 & (uint)fVar8 | ~uVar7 & (uint)fVar9);
  }
  local_48 = ZEXT416((uint)fVar8);
  if (0 < table->ColumnsCount) {
    uVar4 = 0;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar4 & 0x3f) & 1) != 0) {
        pcVar5 = (table->DisplayOrderToIndex).Data + uVar4;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar5) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        cVar1 = *pcVar5;
        pIVar6 = (table->Columns).Data + cVar1;
        if ((table->Columns).DataEnd <= pIVar6) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        if ((pIVar6->Flags & 0x100020U) == 0) {
          id = TableGetColumnResizeID(table,(int)cVar1,(int)table->InstanceCurrent);
          local_60.Min.x = pIVar6->MaxX + -4.0;
          local_60.Max.x = pIVar6->MaxX + 4.0;
          local_60.Min.y = local_64;
          local_60.Max.y = (float)local_48._0_4_;
          KeepAliveID(id);
          local_65 = false;
          local_66 = false;
          bVar3 = ButtonBehavior(&local_60,id,&local_65,&local_66,0x1a2);
          if (((bVar3) && (bVar3 = IsMouseDoubleClicked(0), bVar3)) && ((pIVar6->Flags & 8) == 0)) {
            TableSetColumnAutofit(table,(int)cVar1);
            ClearActiveID();
            local_65 = false;
            local_66 = false;
          }
          if (local_66 == true) {
            table->ResizedColumn = cVar1;
            table->InstanceInteracted = table->InstanceCurrent;
          }
          bVar2 = local_66;
          if (local_65 == true) {
            bVar2 = 0.06 < local_50->HoveredIdTimer | local_66;
          }
          if (bVar2 != 0) {
            table->HoveredColumnBorder = cVar1;
            SetMouseCursor(4);
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)table->ColumnsCount);
  }
  return;
}

Assistant:

void    ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    const bool borders_full_height = (table->IsUsingHeaders == false) || (table->Flags & ImGuiTableFlags_BordersFullHeightV);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_full = ImMax(table->OuterRect.Max.y, hit_y1 + table->LastOuterHeight);
    const float hit_y2 = borders_full_height ? hit_y2_full : (hit_y1 + table->LastFirstRowHeight);

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, hit_y2);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick);
        if (pressed && IsMouseDoubleClicked(0) && !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
        {
            // FIXME-TABLE: Double-clicking on column edge could auto-fit Stretch column?
            TableSetColumnAutofit(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            table->ResizedColumn = (ImS8)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImS8)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}